

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_trigger_pre_parse(App *this,size_t remaining_args)

{
  uint32_t uVar1;
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  
  if (this->pre_parse_called_ == false) {
    this->pre_parse_called_ = true;
    if ((this->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_(unsigned_long)>::operator()(&this->pre_parse_callback_,remaining_args);
      return;
    }
  }
  else if ((this->immediate_callback_ == true) && ((this->name_)._M_string_length != 0)) {
    uVar1 = this->parsed_;
    local_28.
    super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->missing_).
         super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_28.
    super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->missing_).
         super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_28.
    super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->missing_).
         super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->missing_).
    super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->missing_).
    super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->missing_).
    super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clear(this);
    this->parsed_ = uVar1;
    this->pre_parse_called_ = true;
    std::
    vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_move_assign(&this->missing_,&local_28);
    std::
    vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_28);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_trigger_pre_parse(std::size_t remaining_args) {
    if(!pre_parse_called_) {
        pre_parse_called_ = true;
        if(pre_parse_callback_) {
            pre_parse_callback_(remaining_args);
        }
    } else if(immediate_callback_) {
        if(!name_.empty()) {
            auto pcnt = parsed_;
            missing_t extras = std::move(missing_);
            clear();
            parsed_ = pcnt;
            pre_parse_called_ = true;
            missing_ = std::move(extras);
        }
    }
}